

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O2

void __thiscall
itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::resize
          (small_vector<float,_4UL,_0UL,_std::allocator<float>_> *this,size_type n)

{
  float *pfVar1;
  size_type i_1;
  float *pfVar2;
  ulong uVar3;
  size_t sVar4;
  size_type i;
  ulong uVar5;
  
  pfVar2 = choose_data(this,n);
  pfVar1 = this->m_begin;
  if (pfVar2 == pfVar1) {
    pfVar2 = this->m_end;
    while (pfVar1 + n < pfVar2) {
      pfVar2 = pfVar2 + -1;
      this->m_end = pfVar2;
    }
    while (pfVar2 < pfVar1 + n) {
      this->m_end = pfVar2 + 1;
      *pfVar2 = 0.0;
      pfVar2 = pfVar2 + 1;
    }
  }
  else {
    uVar3 = (long)this->m_end - (long)pfVar1 >> 2;
    if (n <= uVar3) {
      uVar3 = n;
    }
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      pfVar2[uVar5] = pfVar1[uVar5];
    }
    for (; n != uVar3; uVar3 = uVar3 + 1) {
      pfVar2[uVar3] = 0.0;
    }
    if ((type *)pfVar2 == this->m_static_data) {
      sVar4 = 4;
    }
    else {
      if ((type *)pfVar1 != this->m_static_data) {
        operator_delete(pfVar1,this->m_capacity << 2);
      }
      sVar4 = this->m_dynamic_capacity;
    }
    this->m_capacity = sVar4;
    this->m_begin = pfVar2;
    this->m_end = pfVar2 + n;
  }
  return;
}

Assistant:

void resize(size_type n)
    {
        auto new_buf = choose_data(n);

        if (new_buf == m_begin)
        {
            // no special transfers needed

            auto new_end = m_begin + n;

            while (m_end > new_end)
            {
                atraits::destroy(get_alloc(), --m_end);
            }

            while (new_end > m_end)
            {
                atraits::construct(get_alloc(), m_end++);
            }
        }
        else
        {
            // we need to transfer the elements into the new buffer

            const auto s = size();
            const auto num_transfer = n < s ? n : s;

            for (size_type i = 0; i < num_transfer; ++i)
            {
                atraits::construct(get_alloc(), new_buf + i, std::move(*(m_begin + i)));
            }

            // free obsoletes
            for (size_type i = 0; i < s; ++i)
            {
                atraits::destroy(get_alloc(), m_begin + i);
            }

            // construct new elements
            for (size_type i = num_transfer; i < n; ++i)
            {
                atraits::construct(get_alloc(), new_buf + i);
            }

            if (new_buf == static_begin_ptr())
            {
                m_capacity = StaticCapacity;
            }
            else
            {
                if (m_begin != static_begin_ptr())
                {
                    // we've moved from dyn to dyn memory, so deallocate the old one
                    atraits::deallocate(get_alloc(), m_begin, m_capacity);
                }
                m_capacity = m_dynamic_capacity;
            }

            m_begin = new_buf;
            m_end = new_buf + n;
        }
    }